

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O2

string * __thiscall
TgBot::TgTypeParser::parseKeyboardButton_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  string *this_00;
  allocator local_39;
  string local_38;
  
  if ((object->super___shared_ptr<TgBot::KeyboardButton,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_38);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    this_00 = &local_38;
    std::__cxx11::string::string((string *)this_00,"text",&local_39);
    appendToJson((TgTypeParser *)this_00,__return_storage_ptr__,&local_38,
                 &((object->super___shared_ptr<TgBot::KeyboardButton,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->text);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::string((string *)&local_38,"request_contact",&local_39);
    appendToJson(this,__return_storage_ptr__,&local_38,
                 &((object->super___shared_ptr<TgBot::KeyboardButton,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->requestContact);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::string((string *)&local_38,"request_location",&local_39);
    appendToJson(this,__return_storage_ptr__,&local_38,
                 &((object->super___shared_ptr<TgBot::KeyboardButton,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->requestLocation);
    std::__cxx11::string::~string((string *)&local_38);
    removeLastComma(this,__return_storage_ptr__);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TgTypeParser::parseKeyboardButton(const KeyboardButton::Ptr& object) const {
    if (!object) {
        return "";
    }
    string result;
    result += '{';
    appendToJson(result, "text", object->text);
    appendToJson(result, "request_contact", object->requestContact);
    appendToJson(result, "request_location", object->requestLocation);
    removeLastComma(result);
    result += '}';
    return result;
}